

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O2

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseMoveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsItem *this_00;
  WindowFrameSection WVar1;
  QGraphicsItem *pQVar2;
  WindowData *pWVar3;
  ulong uVar4;
  QSizeF QVar5;
  qreal qVar6;
  bool bVar7;
  bool bVar8;
  MouseButtons MVar9;
  uint uVar10;
  QGraphicsWidget *widget;
  QGraphicsLayoutItem *this_01;
  long in_FS_OFFSET;
  qreal qVar11;
  qreal qVar12;
  qreal qVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  qreal qVar20;
  double maxh;
  QPointF QVar21;
  QSizeF QVar22;
  QPointF QVar23;
  QPointF QVar24;
  QPointF QVar25;
  QPointF QVar26;
  QPointF QVar27;
  QSizeF QVar28;
  QSizeF QVar29;
  QSizeF QVar30;
  QSizeF local_128;
  qreal local_f8;
  qreal qStack_f0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  QSizeF local_78;
  QPointF local_68;
  qreal local_58;
  qreal qStack_50;
  QSizeF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGraphicsItemPrivate).q_ptr;
  widget = (QGraphicsWidget *)(pQVar2 + -1);
  if (pQVar2 == (QGraphicsItem *)0x0) {
    widget = (QGraphicsWidget *)0x0;
  }
  ensureWindowData(this);
  MVar9 = QGraphicsSceneMouseEvent::buttons(event);
  if ((((uint)MVar9.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
              super_QFlagsStorage<Qt::MouseButton>.i & 1) == 0) ||
     (((this->windowData)._M_t.
       super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       ._M_t.
       super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl)->
      hoveredSubControl != SC_TitleBarLabel)) goto switchD_005ca891_caseD_0;
  this_00 = &(widget->super_QGraphicsObject).super_QGraphicsItem;
  local_68 = QGraphicsSceneMouseEvent::buttonDownScenePos(event,LeftButton);
  QVar21 = QGraphicsItem::mapFromScene(this_00,&local_68);
  dVar16 = QVar21.yp;
  dVar14 = QVar21.xp;
  QVar22 = (QSizeF)QGraphicsSceneMouseEvent::pos(event);
  dVar19 = QVar22.ht;
  dVar17 = QVar22.wd;
  local_68 = QVar21;
  QVar21 = QGraphicsItem::mapToParent(this_00,&local_68);
  local_48 = QVar22;
  QVar23 = QGraphicsItem::mapToParent(this_00,(QPointF *)&local_48);
  local_68.yp = 0.0;
  local_68.xp = dVar14;
  QVar24 = QGraphicsItem::mapToParent(this_00,&local_68);
  local_48.ht = 0.0;
  local_48.wd = dVar17;
  QVar25 = QGraphicsItem::mapToParent(this_00,(QPointF *)&local_48);
  local_68.xp = 0.0;
  local_68.yp = dVar16;
  QVar26 = QGraphicsItem::mapToParent(this_00,&local_68);
  local_48.wd = 0.0;
  local_48.ht = dVar19;
  QVar27 = QGraphicsItem::mapToParent(this_00,(QPointF *)&local_48);
  local_58 = 0.0;
  qStack_50 = 0.0;
  local_68 = (QPointF)ZEXT816(0);
  pWVar3 = (this->windowData)._M_t.
           super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           ._M_t.
           super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
  WVar1 = pWVar3->grabbedSection;
  local_a8 = QVar24.xp;
  local_a0 = QVar24.yp;
  local_b8 = QVar26.xp;
  local_b0 = QVar26.yp;
  local_98 = QVar21.xp;
  local_90 = QVar21.yp;
  switch(WVar1) {
  case NoSection:
    goto switchD_005ca891_caseD_0;
  case LeftSection:
    local_98 = QVar25.xp - local_a8;
    local_90 = QVar25.yp - local_a0;
    goto LAB_005ca95e;
  case TopLeftSection:
    local_98 = QVar23.xp - local_98;
    local_90 = QVar23.yp - local_90;
LAB_005ca95e:
    local_68.xp = local_98 + (pWVar3->startGeometry).xp;
    local_68.yp = local_90 + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w - (dVar17 - dVar14);
    qStack_50 = (pWVar3->startGeometry).h - (dVar19 - dVar16);
    break;
  case TopSection:
    local_68.xp = (QVar27.xp - local_b8) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar27.yp - local_b0) + (pWVar3->startGeometry).yp;
    qStack_50 = (pWVar3->startGeometry).h - (dVar19 - dVar16);
    local_58 = (pWVar3->startGeometry).w;
    break;
  case TopRightSection:
    local_68.xp = (QVar27.xp - local_b8) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar27.yp - local_b0) + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w + (dVar17 - dVar14);
    qStack_50 = (pWVar3->startGeometry).h - (dVar19 - dVar16);
    break;
  case RightSection:
    local_68.xp = (pWVar3->startGeometry).xp;
    local_68.yp = (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w;
    qStack_50 = (pWVar3->startGeometry).h;
    dVar17 = dVar17 - dVar14;
    dVar19 = 0.0;
    goto LAB_005caa51;
  case BottomRightSection:
    local_68.xp = (pWVar3->startGeometry).xp;
    local_68.yp = (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w;
    qStack_50 = (pWVar3->startGeometry).h;
    dVar17 = dVar17 - dVar14;
    dVar19 = dVar19 - dVar16;
    goto LAB_005caa51;
  case BottomSection:
    local_68.xp = (pWVar3->startGeometry).xp;
    local_68.yp = (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w;
    qStack_50 = (pWVar3->startGeometry).h;
    dVar19 = dVar19 - dVar16;
    dVar17 = 0.0;
LAB_005caa51:
    local_58 = dVar17 + local_58;
    qStack_50 = dVar19 + qStack_50;
    break;
  case BottomLeftSection:
    local_68.xp = (QVar25.xp - local_a8) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar25.yp - local_a0) + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w - (dVar17 - dVar14);
    qStack_50 = (dVar19 - dVar16) + (pWVar3->startGeometry).h;
    break;
  case TitleBarArea:
    local_68.xp = (QVar23.xp - local_98) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar23.yp - local_90) + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w;
    qStack_50 = (pWVar3->startGeometry).h;
    break;
  default:
    goto switchD_005ca891_default;
  }
switchD_005ca891_default:
  this_01 = &widget->super_QGraphicsLayoutItem;
  local_48.wd = -1.0;
  local_48.ht = -1.0;
  QVar22 = QGraphicsLayoutItem::effectiveSizeHint(this_01,MinimumSize,&local_48);
  qVar12 = QVar22.wd;
  local_78.wd = -1.0;
  local_78.ht = -1.0;
  QVar28 = QGraphicsLayoutItem::effectiveSizeHint(this_01,MaximumSize,&local_78);
  qVar6 = qStack_50;
  qVar20 = local_58;
  qVar11 = QVar28.wd;
  auVar18._8_8_ = qStack_50;
  auVar18._0_8_ = local_58;
  local_128.wd = local_58;
  auVar18 = minpd((undefined1  [16])QVar28,auVar18);
  auVar18 = maxpd(auVar18,(undefined1  [16])QVar22);
  if (pQVar2 == (QGraphicsItem *)0x0) {
    this_01 = (QGraphicsLayoutItem *)0x0;
  }
  bVar7 = QGraphicsLayoutItemPrivate::hasHeightForWidth((this_01->d_ptr).d);
  bVar8 = QGraphicsLayoutItemPrivate::hasWidthForHeight((this_01->d_ptr).d);
  QVar29 = QGraphicsWidget::size((QGraphicsWidget *)widget);
  QVar30 = QGraphicsWidget::size((QGraphicsWidget *)widget);
  local_f8 = auVar18._0_8_;
  qStack_f0 = auVar18._8_8_;
  QVar5.ht = qStack_f0;
  QVar5.wd = QVar22.ht;
  if ((bVar8 || bVar7) && (qVar6 != QVar30.ht || QVar29.wd != qVar20)) {
    qVar20 = qStack_f0;
    if (bVar7) {
      local_128.wd = qVar6;
      qVar20 = local_f8;
      qVar11 = QVar28.ht;
      qVar12 = QVar22.ht;
    }
    qVar11 = minimumHeightForWidth(qVar20,qVar12,qVar11,widget,bVar7);
    qVar20 = local_f8;
    if (local_128.wd < qVar11) {
      QVar22 = QGraphicsWidget::size((QGraphicsWidget *)widget);
      qVar11 = QVar22.wd;
      minimumHeightForWidth(qVar11,qStack_f0,QVar22.ht,widget,true);
      dVar14 = local_f8;
      do {
        maxh = QVar22.ht;
        dVar19 = QVar22.wd;
        uVar10 = (uint)(dVar19 - dVar14 < 0.1);
        auVar15._0_8_ = CONCAT44((int)(uVar10 << 0x1f) >> 0x1f,(int)(uVar10 << 0x1f) >> 0x1f);
        auVar15._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
        auVar15._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
        dVar17 = (double)(~auVar15._0_8_ & (ulong)dVar14 | (ulong)dVar19 & auVar15._0_8_);
        dVar16 = (double)(~auVar15._8_8_ & (ulong)qStack_f0 | (ulong)maxh & auVar15._8_8_);
        qVar20 = (dVar19 - dVar17) * 0.5 + dVar17;
        qStack_f0 = (maxh - dVar16) * 0.5 + dVar16;
        local_128.ht = qStack_f0;
        local_128.wd = qVar20;
        qVar12 = minimumHeightForWidth(qVar20,dVar16,maxh,widget,true);
        dVar14 = qVar20;
        QVar28 = QVar22;
        if ((qVar12 <= qStack_f0) &&
           (bVar7 = qStack_f0 < qVar12, dVar14 = dVar17, qStack_f0 = dVar16, QVar28 = local_128,
           bVar7)) {
          QVar28 = QVar22;
        }
        QVar22 = QVar28;
        qVar12 = QVar22.ht;
        dVar17 = QVar22.wd;
      } while ((dVar17 != dVar14) || (NAN(dVar17) || NAN(dVar14)));
      qVar13 = minimumHeightForWidth(qVar20,qStack_f0,qVar12,widget,true);
      QVar5.ht = qVar13;
      QVar5.wd = dVar17;
      if (qVar12 <= qVar13) {
        qVar20 = minimumHeightForWidth(qVar12,local_f8,qVar11,widget,false);
        QVar5 = QVar22;
      }
    }
    qStack_f0 = QVar5.ht;
    local_f8 = qVar20;
  }
  uVar4 = (ulong)DAT_005e55c0;
  switch(WVar1) {
  case LeftSection:
    local_58 = (qreal)(int)((double)((ulong)local_f8 & 0x8000000000000000 | uVar4) + local_f8);
    qStack_50 = (pWVar3->startGeometry).h;
    local_68.yp = (pWVar3->startGeometry).yp;
    local_68.xp = ((pWVar3->startGeometry).xp + (pWVar3->startGeometry).w) - local_58;
    break;
  case TopLeftSection:
    local_58 = (qreal)(int)((double)((ulong)local_f8 & 0x8000000000000000 | 0x3fe0000000000000) +
                           local_f8);
    qStack_50 = (qreal)(int)((double)((ulong)qStack_f0 & 0x8000000000000000 | 0x3fe0000000000000) +
                            qStack_f0);
    local_68.yp = ((pWVar3->startGeometry).h + (pWVar3->startGeometry).yp) - qStack_50;
    local_68.xp = ((pWVar3->startGeometry).w + (pWVar3->startGeometry).xp) - local_58;
    break;
  case TopSection:
    qStack_50 = (qreal)(int)((double)((ulong)qStack_f0 & 0x8000000000000000 | uVar4) + qStack_f0);
    local_58 = (pWVar3->startGeometry).w;
    local_68.yp = ((pWVar3->startGeometry).yp + (pWVar3->startGeometry).h) - qStack_50;
    local_68.xp = (pWVar3->startGeometry).xp;
    break;
  case TopRightSection:
    dVar14 = ((local_68.yp + qVar6) -
             (double)(int)((double)((ulong)qStack_f0 & 0x8000000000000000 | 0x3fe0000000000000) +
                          qStack_f0)) - local_68.yp;
    local_68.yp = local_68.yp + dVar14;
    qStack_50 = qVar6 - dVar14;
    dVar14 = (double)((ulong)local_f8 & 0x8000000000000000 | 0x3fe0000000000000);
    goto LAB_005caf1d;
  case RightSection:
    dVar14 = (double)((ulong)local_f8 & 0x8000000000000000 | uVar4);
LAB_005caf1d:
    local_58 = (qreal)(int)(dVar14 + local_f8);
    break;
  case BottomRightSection:
    local_58 = (qreal)(int)((double)((ulong)local_f8 & 0x8000000000000000 | 0x3fe0000000000000) +
                           local_f8);
    qStack_50 = (qreal)(int)((double)((ulong)qStack_f0 & 0x8000000000000000 | 0x3fe0000000000000) +
                            qStack_f0);
    break;
  case BottomSection:
    qStack_50 = (qreal)(int)((double)((ulong)qStack_f0 & 0x8000000000000000 | uVar4) + qStack_f0);
    break;
  case BottomLeftSection:
    local_58 = (qreal)(int)((double)((ulong)local_f8 & 0x8000000000000000 | 0x3fe0000000000000) +
                           local_f8);
    qStack_50 = (qreal)(int)((double)((ulong)qStack_f0 & 0x8000000000000000 | 0x3fe0000000000000) +
                            qStack_f0);
    local_68.yp = (pWVar3->startGeometry).yp;
    local_68.xp = ((pWVar3->startGeometry).xp + (pWVar3->startGeometry).w) - local_58;
  }
  (**(code **)(*(long *)&widget->super_QGraphicsObject + 0x60))(widget,&local_68);
switchD_005ca891_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (!(event->buttons() & Qt::LeftButton) || windowData->hoveredSubControl != QStyle::SC_TitleBarLabel)
        return;

    QLineF delta(q->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)), event->pos());
    QLineF parentDelta(q->mapToParent(delta.p1()), q->mapToParent(delta.p2()));
    QLineF parentXDelta(q->mapToParent(QPointF(delta.p1().x(), 0)), q->mapToParent(QPointF(delta.p2().x(), 0)));
    QLineF parentYDelta(q->mapToParent(QPointF(0, delta.p1().y())), q->mapToParent(QPointF(0, delta.p2().y())));

    QRectF newGeometry;
    switch (windowData->grabbedSection) {
    case Qt::LeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentXDelta.dx(), parentXDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::TopLeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentDelta.dx(), parentDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::TopSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentYDelta.dx(), parentYDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(0, delta.dy()));
        break;
    case Qt::TopRightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentYDelta.dx(), parentYDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(-delta.dx(), delta.dy()));
        break;
    case Qt::RightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(delta.dx(), 0));
        break;
    case Qt::BottomRightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::BottomSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(0, delta.dy()));
        break;
    case Qt::BottomLeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentXDelta.dx(), parentXDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), -delta.dy()));
        break;
    case Qt::TitleBarArea:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentDelta.dx(), parentDelta.dy()),
                             windowData->startGeometry.size());
        break;
    case Qt::NoSection:
        break;
    }

    if (windowData->grabbedSection != Qt::NoSection) {
        _q_boundGeometryToSizeConstraints(windowData->startGeometry, &newGeometry,
                                          windowData->grabbedSection,
                                          q->effectiveSizeHint(Qt::MinimumSize),
                                          q->effectiveSizeHint(Qt::MaximumSize),
                                          q);
        q->setGeometry(newGeometry);
    }
}